

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__close_nocheckstdio(int fd)

{
  int iVar1;
  int *piVar2;
  int local_14;
  int rc;
  int saved_errno;
  int fd_local;
  
  if (-1 < fd) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    local_14 = uv__close_nocancel(fd);
    if (local_14 == -1) {
      piVar2 = __errno_location();
      local_14 = -*piVar2;
      if ((local_14 == -4) || (local_14 == -0x73)) {
        local_14 = 0;
      }
      piVar2 = __errno_location();
      *piVar2 = iVar1;
    }
    return local_14;
  }
  __assert_fail("fd > -1",
                "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/core.c"
                ,0x269,"int uv__close_nocheckstdio(int)");
}

Assistant:

int uv__close_nocheckstdio(int fd) {
  int saved_errno;
  int rc;

  assert(fd > -1);  /* Catch uninitialized io_watcher.fd bugs. */

  saved_errno = errno;
  rc = uv__close_nocancel(fd);
  if (rc == -1) {
    rc = UV__ERR(errno);
    if (rc == UV_EINTR || rc == UV__ERR(EINPROGRESS))
      rc = 0;    /* The close is in progress, not an error. */
    errno = saved_errno;
  }

  return rc;
}